

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall embree::SceneGraph::HairSetNode::resetInDegree(HairSetNode *this)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x58) = 0;
  if (*(long *)(in_RDI + 0x50) == 1) {
    (**(code **)(**(long **)(in_RDI + 0x108) + 0x40))();
  }
  *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + -1;
  return;
}

Assistant:

void SceneGraph::HairSetNode::resetInDegree()
  {
    closed = false;
    if (indegree == 1)
      material->resetInDegree();
    indegree--;
  }